

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall PhPacker_Arg_L_Test::TestBody(PhPacker_Arg_L_Test *this)

{
  undefined1 *puVar1;
  uint uVar2;
  uint *puVar3;
  char *pcVar4;
  size_t result;
  size_t expected;
  string str;
  AssertHelper local_70;
  Message local_68;
  undefined1 local_60 [8];
  _Storage local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  ulong local_40;
  unsigned_long local_38;
  string local_30;
  
  PhPacker::pack<unsigned_int,_0>(&local_30,'L',0x270fddc2);
  PhPacker::unpack((PhPacker *)local_60,'L',&local_30);
  puVar3 = (uint *)std::__any_caster<unsigned_int>((any *)local_60);
  if (puVar3 == (uint *)0x0) {
    std::__throw_bad_any_cast();
  }
  uVar2 = *puVar3;
  if ((code *)CONCAT71(local_60._1_7_,local_60[0]) != (code *)0x0) {
    (*(code *)CONCAT71(local_60._1_7_,local_60[0]))(3,local_60,0);
  }
  local_38 = 0x270fddc2;
  local_40 = (ulong)uVar2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_60,"result","expected",&local_40,&local_38);
  if (local_60[0] == (PhPacker)0x0) {
    testing::Message::Message(&local_68);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *local_58._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0xa5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_ptr !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_60 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_58._M_ptr);
    }
    PhPacker::pack<unsigned_int,_0>((string *)local_60,'L',0x41);
    std::__cxx11::string::operator=((string *)&local_30,(string *)local_60);
    puVar1 = local_60 + 0x10;
    if ((undefined1 *)CONCAT71(local_60._1_7_,local_60[0]) != puVar1) {
      operator_delete((undefined1 *)CONCAT71(local_60._1_7_,local_60[0]),
                      local_50._M_allocated_capacity + 1);
    }
    PhPacker::unpack((PhPacker *)local_60,'L',&local_30);
    puVar3 = (uint *)std::__any_caster<unsigned_int>((any *)local_60);
    if (puVar3 == (uint *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_40 = (ulong)*puVar3;
    if ((code *)CONCAT71(local_60._1_7_,local_60[0]) != (code *)0x0) {
      (*(code *)CONCAT71(local_60._1_7_,local_60[0]))(3,local_60,0);
    }
    local_38 = 0x41;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_60,"result","expected",&local_40,&local_38);
    if (local_60[0] == (PhPacker)0x0) {
      testing::Message::Message(&local_68);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_ptr ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *local_58._M_ptr;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                 ,0xaa,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,&local_68);
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_ptr !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_60 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_58._M_ptr);
      }
      PhPacker::pack<unsigned_int,_0>((string *)local_60,'L',0xffffffff);
      std::__cxx11::string::operator=((string *)&local_30,(string *)local_60);
      if ((undefined1 *)CONCAT71(local_60._1_7_,local_60[0]) != puVar1) {
        operator_delete((undefined1 *)CONCAT71(local_60._1_7_,local_60[0]),
                        local_50._M_allocated_capacity + 1);
      }
      PhPacker::unpack((PhPacker *)local_60,'L',&local_30);
      puVar3 = (uint *)std::__any_caster<unsigned_int>((any *)local_60);
      if (puVar3 == (uint *)0x0) {
        std::__throw_bad_any_cast();
      }
      local_40 = (ulong)*puVar3;
      if ((code *)CONCAT71(local_60._1_7_,local_60[0]) != (code *)0x0) {
        (*(code *)CONCAT71(local_60._1_7_,local_60[0]))(3,local_60,0);
      }
      local_38 = 0xffffffff;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_60,"result","expected",&local_40,&local_38);
      if (local_60[0] == (PhPacker)0x0) {
        testing::Message::Message(&local_68);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_ptr ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *local_58._M_ptr;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                   ,0xaf,pcVar4);
        testing::internal::AssertHelper::operator=(&local_70,&local_68);
      }
      else {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_ptr !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_60 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_58._M_ptr);
        }
        PhPacker::pack<unsigned_int,_0>((string *)local_60,'L',0);
        std::__cxx11::string::operator=((string *)&local_30,(string *)local_60);
        if ((undefined1 *)CONCAT71(local_60._1_7_,local_60[0]) != puVar1) {
          operator_delete((undefined1 *)CONCAT71(local_60._1_7_,local_60[0]),
                          local_50._M_allocated_capacity + 1);
        }
        PhPacker::unpack((PhPacker *)local_60,'L',&local_30);
        puVar3 = (uint *)std::__any_caster<unsigned_int>((any *)local_60);
        if (puVar3 == (uint *)0x0) {
          std::__throw_bad_any_cast();
        }
        local_40 = (ulong)*puVar3;
        if ((code *)CONCAT71(local_60._1_7_,local_60[0]) != (code *)0x0) {
          (*(code *)CONCAT71(local_60._1_7_,local_60[0]))(3,local_60,0);
        }
        local_38 = 0;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_60,"result","expected",&local_40,&local_38);
        if (local_60[0] != (PhPacker)0x0) goto LAB_0010e4d0;
        testing::Message::Message(&local_68);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_ptr ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *local_58._M_ptr;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                   ,0xb5,pcVar4);
        testing::internal::AssertHelper::operator=(&local_70,&local_68);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_68.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_68.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
LAB_0010e4d0:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_ptr !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_60 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_58._M_ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PhPacker, Arg_L)
{
   std::string str = PhPacker::pack<uint32_t>('L', 655351234);
   size_t result = std::any_cast<uint32_t>(PhPacker::unpack('L', str));
   size_t expected = 655351234;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint32_t>('L', 65);
   result = std::any_cast<uint32_t>(PhPacker::unpack('L', str));
   expected = 65;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint32_t>('L', std::numeric_limits<uint32_t>::max());
   result = std::any_cast<uint32_t>(PhPacker::unpack('L', str));
   expected = std::numeric_limits<uint32_t>::max();
   GTEST_ASSERT_EQ(result, expected);


   str = PhPacker::pack<uint32_t>('L', std::numeric_limits<uint32_t>::min());
   result = std::any_cast<uint32_t>(PhPacker::unpack('L', str));
   expected = std::numeric_limits<uint32_t>::min();
   GTEST_ASSERT_EQ(result, expected);
}